

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.c
# Opt level: O1

void test_bson_utf8_invalid(void)

{
  char cVar1;
  int iVar2;
  long lVar3;
  int *piVar4;
  long *plVar5;
  char *pcVar6;
  uchar *puVar7;
  size_t sVar8;
  char *unaff_RBX;
  char **ppcVar9;
  int iStack_34;
  short sStack_2e;
  char cStack_2c;
  code *pcStack_28;
  code *pcStack_20;
  code *pcStack_18;
  
  cVar1 = bson_utf8_validate(test_bson_utf8_invalid::bad,1,1);
  if (cVar1 == '\0') {
    cVar1 = bson_utf8_validate(test_bson_utf8_invalid::bad,1,0);
    if (cVar1 != '\0') goto LAB_00135a3d;
    lVar3 = bson_utf8_escape_for_json(test_bson_utf8_invalid::bad,1);
    if (lVar3 == 0) {
      return;
    }
  }
  else {
    test_bson_utf8_invalid_cold_3();
LAB_00135a3d:
    test_bson_utf8_invalid_cold_2();
  }
  test_bson_utf8_invalid_cold_1();
  pcStack_18 = (code *)0x135a5e;
  cVar1 = bson_utf8_validate("a",3,1);
  if (cVar1 == '\0') {
    pcStack_18 = (code *)0x135afb;
    test_bson_utf8_nil_cold_1();
LAB_00135afb:
    pcStack_18 = (code *)0x135b00;
    test_bson_utf8_nil_cold_4();
LAB_00135b00:
    pcStack_18 = (code *)0x135b08;
    test_bson_utf8_nil_cold_2();
  }
  else {
    pcStack_18 = (code *)0x135a79;
    cVar1 = bson_utf8_validate("a",3,0);
    if (cVar1 != '\0') goto LAB_00135afb;
    pcStack_18 = (code *)0x135a90;
    unaff_RBX = (char *)bson_utf8_escape_for_json("a",0xffffffffffffffff);
    if (unaff_RBX != "a") {
      pcStack_18 = (code *)0x135aae;
      iVar2 = strcmp("a",unaff_RBX);
      if (iVar2 == 0) goto LAB_00135ab2;
      goto LAB_00135b00;
    }
LAB_00135ab2:
    pcStack_18 = (code *)0x135aba;
    bson_free(unaff_RBX);
    pcStack_18 = (code *)0x135acb;
    unaff_RBX = (char *)bson_utf8_escape_for_json("a",3);
    if (unaff_RBX == "a\\u0000b") {
LAB_00135aed:
      bson_free(unaff_RBX);
      return;
    }
    pcStack_18 = (code *)0x135ae9;
    iVar2 = strcmp("a\\u0000b",unaff_RBX);
    if (iVar2 == 0) goto LAB_00135aed;
  }
  pcStack_18 = test_bson_utf8_escape_for_json;
  test_bson_utf8_nil_cold_3();
  pcStack_20 = (code *)0x135b22;
  pcStack_18 = (code *)unaff_RBX;
  piVar4 = (int *)bson_utf8_escape_for_json("my",6);
  if (*(int *)((long)piVar4 + 3) == 0x30303075 && *piVar4 == 0x755c796d) {
    unaff_RBX = (char *)0x79656b225c796d;
    pcStack_20 = (code *)0x135b4b;
    bson_free(piVar4);
    pcStack_20 = (code *)0x135b5c;
    plVar5 = (long *)bson_utf8_escape_for_json("my\"key",6);
    if (*plVar5 != 0x79656b225c796d) goto LAB_00135bf7;
    pcStack_20 = (code *)0x135b6d;
    bson_free(plVar5);
    pcStack_20 = (code *)0x135b7e;
    plVar5 = (long *)bson_utf8_escape_for_json("my\\key",6);
    unaff_RBX = (char *)0x79656b5c5c796d;
    if (*plVar5 != 0x79656b5c5c796d) goto LAB_00135bfc;
    pcStack_20 = (code *)0x135b92;
    bson_free(plVar5);
    pcStack_20 = (code *)0x135ba5;
    plVar5 = (long *)bson_utf8_escape_for_json("\\\"\\\"",0xffffffffffffffff);
    if ((char)plVar5[1] != '\0' || *plVar5 != 0x225c5c5c225c5c5c) goto LAB_00135c01;
    pcStack_20 = (code *)0x135bc3;
    bson_free(plVar5);
    pcStack_20 = (code *)0x135bd6;
    piVar4 = (int *)bson_utf8_escape_for_json("\x0e",0xffffffffffffffff);
    if (*(int *)((long)piVar4 + 3) == 0x653030 && *piVar4 == 0x3030755c) {
      bson_free(piVar4);
      return;
    }
  }
  else {
    pcStack_20 = (code *)0x135bf7;
    test_bson_utf8_escape_for_json_cold_1();
LAB_00135bf7:
    pcStack_20 = (code *)0x135bfc;
    test_bson_utf8_escape_for_json_cold_2();
LAB_00135bfc:
    pcStack_20 = (code *)0x135c01;
    test_bson_utf8_escape_for_json_cold_3();
LAB_00135c01:
    pcStack_20 = (code *)0x135c06;
    test_bson_utf8_escape_for_json_cold_4();
  }
  pcStack_20 = test_bson_utf8_get_char;
  test_bson_utf8_escape_for_json_cold_5();
  pcStack_28 = (code *)0x135c18;
  pcStack_20 = (code *)unaff_RBX;
  iVar2 = bson_utf8_get_char("asdf");
  if (iVar2 == 0x61) {
    pcStack_28 = (code *)0x135c2d;
    unaff_RBX = (char *)bson_utf8_next_char("asdf");
    pcStack_28 = (code *)0x135c38;
    iVar2 = bson_utf8_get_char(unaff_RBX);
    if (iVar2 != 0x73) goto LAB_00135d36;
    pcStack_28 = (code *)0x135c49;
    unaff_RBX = (char *)bson_utf8_next_char(unaff_RBX);
    pcStack_28 = (code *)0x135c54;
    iVar2 = bson_utf8_get_char(unaff_RBX);
    if (iVar2 != 100) goto LAB_00135d3b;
    pcStack_28 = (code *)0x135c65;
    unaff_RBX = (char *)bson_utf8_next_char(unaff_RBX);
    pcStack_28 = (code *)0x135c70;
    iVar2 = bson_utf8_get_char(unaff_RBX);
    if (iVar2 != 0x66) goto LAB_00135d40;
    pcStack_28 = (code *)0x135c81;
    pcVar6 = (char *)bson_utf8_next_char(unaff_RBX);
    if (*pcVar6 != '\0') goto LAB_00135d45;
    pcStack_28 = (code *)0x135c96;
    iVar2 = bson_utf8_get_char(test_bson_utf8_get_char::test2);
    if (iVar2 != 0x20ac) goto LAB_00135d4a;
    pcStack_28 = (code *)0x135cad;
    puVar7 = (uchar *)bson_utf8_next_char(test_bson_utf8_get_char::test2);
    if (puVar7 != test_bson_utf8_get_char::test2 + 3) goto LAB_00135d4f;
    pcStack_28 = (code *)0x135cc9;
    iVar2 = bson_utf8_get_char(test_bson_utf8_get_char::test2 + 3);
    if (iVar2 != 0x20) goto LAB_00135d54;
    pcStack_28 = (code *)0x135cde;
    unaff_RBX = (char *)bson_utf8_next_char(test_bson_utf8_get_char::test2 + 3);
    pcStack_28 = (code *)0x135ce9;
    iVar2 = bson_utf8_get_char(unaff_RBX);
    if (iVar2 != 0x20ac) goto LAB_00135d59;
    pcStack_28 = (code *)0x135cf8;
    unaff_RBX = (char *)bson_utf8_next_char(unaff_RBX);
    pcStack_28 = (code *)0x135d03;
    iVar2 = bson_utf8_get_char(unaff_RBX);
    if (iVar2 != 0x20) goto LAB_00135d5e;
    pcStack_28 = (code *)0x135d10;
    unaff_RBX = (char *)bson_utf8_next_char(unaff_RBX);
    pcStack_28 = (code *)0x135d1b;
    iVar2 = bson_utf8_get_char(unaff_RBX);
    if (iVar2 != 0x20ac) goto LAB_00135d63;
    pcStack_28 = (code *)0x135d2a;
    pcVar6 = (char *)bson_utf8_next_char(unaff_RBX);
    if (*pcVar6 == '\0') {
      return;
    }
  }
  else {
    pcStack_28 = (code *)0x135d36;
    test_bson_utf8_get_char_cold_1();
LAB_00135d36:
    pcStack_28 = (code *)0x135d3b;
    test_bson_utf8_get_char_cold_2();
LAB_00135d3b:
    pcStack_28 = (code *)0x135d40;
    test_bson_utf8_get_char_cold_3();
LAB_00135d40:
    pcStack_28 = (code *)0x135d45;
    test_bson_utf8_get_char_cold_4();
LAB_00135d45:
    pcStack_28 = (code *)0x135d4a;
    test_bson_utf8_get_char_cold_5();
LAB_00135d4a:
    pcStack_28 = (code *)0x135d4f;
    test_bson_utf8_get_char_cold_6();
LAB_00135d4f:
    pcStack_28 = (code *)0x135d54;
    test_bson_utf8_get_char_cold_7();
LAB_00135d54:
    pcStack_28 = (code *)0x135d59;
    test_bson_utf8_get_char_cold_8();
LAB_00135d59:
    pcStack_28 = (code *)0x135d5e;
    test_bson_utf8_get_char_cold_9();
LAB_00135d5e:
    pcStack_28 = (code *)0x135d63;
    test_bson_utf8_get_char_cold_10();
LAB_00135d63:
    pcStack_28 = (code *)0x135d68;
    test_bson_utf8_get_char_cold_11();
  }
  pcStack_28 = test_bson_utf8_from_unichar;
  test_bson_utf8_get_char_cold_12();
  pcStack_28 = (code *)unaff_RBX;
  bson_utf8_from_unichar(0,&sStack_2e,&iStack_34);
  if (iStack_34 == 1) {
    bson_utf8_from_unichar(0x80,&sStack_2e,&iStack_34);
    if (iStack_34 != 2) goto LAB_0013602c;
    bson_utf8_from_unichar(0x800,&sStack_2e,&iStack_34);
    if (iStack_34 != 3) goto LAB_00136031;
    bson_utf8_from_unichar(0x10000,&sStack_2e,&iStack_34);
    if (iStack_34 != 4) goto LAB_00136036;
    bson_utf8_from_unichar(0x200000,&sStack_2e,&iStack_34);
    if (iStack_34 != 5) goto LAB_0013603b;
    bson_utf8_from_unichar(0x4000000,&sStack_2e,&iStack_34);
    if (iStack_34 != 6) goto LAB_00136040;
    bson_utf8_from_unichar(0x7f,&sStack_2e,&iStack_34);
    if (iStack_34 != 1) goto LAB_00136045;
    bson_utf8_from_unichar(0x7ff,&sStack_2e,&iStack_34);
    if (iStack_34 != 2) goto LAB_0013604a;
    bson_utf8_from_unichar(0xffff,&sStack_2e,&iStack_34);
    if (iStack_34 != 3) goto LAB_0013604f;
    bson_utf8_from_unichar(0x1fffff,&sStack_2e,&iStack_34);
    if (iStack_34 != 4) goto LAB_00136054;
    bson_utf8_from_unichar(0x3ffffff,&sStack_2e,&iStack_34);
    if (iStack_34 != 5) goto LAB_00136059;
    bson_utf8_from_unichar(0x7fffffff,&sStack_2e,&iStack_34);
    if (iStack_34 != 6) goto LAB_0013605e;
    bson_utf8_from_unichar(0xd7ff,&sStack_2e,&iStack_34);
    if (iStack_34 != 3) goto LAB_00136063;
    bson_utf8_from_unichar(0xe000,&sStack_2e,&iStack_34);
    if (iStack_34 != 3) goto LAB_00136068;
    bson_utf8_from_unichar(0xfffd,&sStack_2e,&iStack_34);
    if (iStack_34 != 3) goto LAB_0013606d;
    bson_utf8_from_unichar(0x10ffff,&sStack_2e,&iStack_34);
    if (iStack_34 != 4) goto LAB_00136072;
    bson_utf8_from_unichar(0x110000,&sStack_2e,&iStack_34);
    if (iStack_34 != 4) goto LAB_00136077;
    bson_utf8_from_unichar(0x61,&sStack_2e,&iStack_34);
    if (iStack_34 != 1) goto LAB_0013607c;
    if ((char)sStack_2e != 'a') goto LAB_00136081;
    bson_utf8_from_unichar(0xff,&sStack_2e,&iStack_34);
    if (iStack_34 != 2) goto LAB_00136086;
    if (sStack_2e != -0x403d) goto LAB_0013608b;
    bson_utf8_from_unichar(0x20ac,&sStack_2e,&iStack_34);
    if (iStack_34 == 3) {
      if (cStack_2c == -0x54 && sStack_2e == -0x7d1e) {
        return;
      }
      goto LAB_00136095;
    }
  }
  else {
    test_bson_utf8_from_unichar_cold_1();
LAB_0013602c:
    test_bson_utf8_from_unichar_cold_2();
LAB_00136031:
    test_bson_utf8_from_unichar_cold_3();
LAB_00136036:
    test_bson_utf8_from_unichar_cold_4();
LAB_0013603b:
    test_bson_utf8_from_unichar_cold_5();
LAB_00136040:
    test_bson_utf8_from_unichar_cold_6();
LAB_00136045:
    test_bson_utf8_from_unichar_cold_7();
LAB_0013604a:
    test_bson_utf8_from_unichar_cold_8();
LAB_0013604f:
    test_bson_utf8_from_unichar_cold_9();
LAB_00136054:
    test_bson_utf8_from_unichar_cold_10();
LAB_00136059:
    test_bson_utf8_from_unichar_cold_11();
LAB_0013605e:
    test_bson_utf8_from_unichar_cold_12();
LAB_00136063:
    test_bson_utf8_from_unichar_cold_13();
LAB_00136068:
    test_bson_utf8_from_unichar_cold_14();
LAB_0013606d:
    test_bson_utf8_from_unichar_cold_15();
LAB_00136072:
    test_bson_utf8_from_unichar_cold_16();
LAB_00136077:
    test_bson_utf8_from_unichar_cold_17();
LAB_0013607c:
    test_bson_utf8_from_unichar_cold_18();
LAB_00136081:
    test_bson_utf8_from_unichar_cold_19();
LAB_00136086:
    test_bson_utf8_from_unichar_cold_20();
LAB_0013608b:
    test_bson_utf8_from_unichar_cold_21();
  }
  test_bson_utf8_from_unichar_cold_22();
LAB_00136095:
  test_bson_utf8_from_unichar_cold_23();
  ppcVar9 = test_bson_utf8_non_shortest::tests;
  puVar7 = (uchar *)0x0;
  do {
    pcVar6 = *ppcVar9;
    sVar8 = strlen(pcVar6);
    cVar1 = bson_utf8_validate(pcVar6,sVar8,0);
    if (cVar1 != '\0') {
      test_bson_utf8_non_shortest_cold_2();
      goto LAB_001360f9;
    }
    puVar7 = (uchar *)((long)&((TestSuite *)puVar7)->prgname + 1);
    ppcVar9 = ppcVar9 + 1;
  } while ((TestSuite *)puVar7 != (TestSuite *)0x5);
  puVar7 = test_bson_utf8_validate::test2;
  cVar1 = bson_utf8_validate(test_bson_utf8_validate::test2,2,1);
  if (cVar1 != '\0') {
    return;
  }
LAB_001360f9:
  test_bson_utf8_non_shortest_cold_1();
  TestSuite_Add((TestSuite *)puVar7,"/bson/value/basic",test_value_basic);
  TestSuite_Add((TestSuite *)puVar7,"/bson/value/decimal128",test_value_decimal128);
  return;
}

Assistant:

static void
test_bson_utf8_invalid (void)
{
   /* no UTF-8 sequence can start with 0x80 */
   static const unsigned char bad[] = {0x80, 0};

   BSON_ASSERT (!bson_utf8_validate ((const char *) bad, 1, true));
   BSON_ASSERT (!bson_utf8_validate ((const char *) bad, 1, false));
   BSON_ASSERT (!bson_utf8_escape_for_json ((const char *) bad, 1));
}